

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O3

void x86_64_branch(dill_stream s,int op,int type,int src1,int src2,int label)

{
  char **ppcVar1;
  private_ctx pdVar2;
  uint rex;
  uint uVar3;
  char *pcVar4;
  uchar *puVar5;
  
  uVar3 = (uint)(type - 6U < 3) * 8;
  if (((uint)type < 8) && ((0xaaU >> (type & 0x1fU) & 1) != 0)) {
    op = op + 6;
  }
  rex = uVar3 + 4 + (uint)(7 < src1);
  if (src2 < 8) {
    rex = uVar3 | 7 < src1;
  }
  uVar3 = (src1 & 7U) + (src2 & 0x1fU) * 8 | 0xc0;
  if (type == 9) {
    BYTE_OUT3R(s,rex,0xf,0x2e,uVar3);
  }
  else {
    if (type != 10) {
      BYTE_OUT2R(s,rex,0x39,uVar3);
      dill_mark_branch_location(s,label);
      pcVar4 = s->p->cur_ip;
      if (s->p->code_limit <= pcVar4) {
        extend_dill_stream(s);
        pcVar4 = s->p->cur_ip;
      }
      *pcVar4 = '\x0f';
      puVar5 = op_conds;
      goto LAB_0011a79d;
    }
    BYTE_OUT1R3(s,0x66,rex,0x2e,uVar3,label);
  }
  dill_mark_branch_location(s,label);
  pcVar4 = s->p->cur_ip;
  if (s->p->code_limit <= pcVar4) {
    extend_dill_stream(s);
    pcVar4 = s->p->cur_ip;
  }
  *pcVar4 = '\x0f';
  puVar5 = fop_conds;
LAB_0011a79d:
  s->p->cur_ip[1] = puVar5[op];
  pcVar4 = s->p->cur_ip;
  pcVar4[2] = '\0';
  pcVar4[3] = '\0';
  pcVar4[4] = '\0';
  pcVar4[5] = '\0';
  if (s->dill_debug != 0) {
    dump_cur_dill_insn(s);
  }
  pdVar2 = s->p;
  pcVar4 = pdVar2->cur_ip + 6;
  pdVar2->cur_ip = pcVar4;
  if (pdVar2->code_limit <= pcVar4) {
    extend_dill_stream(s);
    pcVar4 = s->p->cur_ip;
  }
  *pcVar4 = -0x70;
  if (s->dill_debug != 0) {
    dump_cur_dill_insn(s);
  }
  ppcVar1 = &s->p->cur_ip;
  *ppcVar1 = *ppcVar1 + 1;
  return;
}

Assistant:

extern void
x86_64_branch(dill_stream s, int op, int type, int src1, int src2, int label)
{
    int rex = 0;
    if ((type == DILL_L) || (type == DILL_UL) || (type == DILL_P))
        rex |= REX_W;

    switch (type) {
    case DILL_U:
    case DILL_UL:
    case DILL_US:
    case DILL_UC:
        op += 6; /* second set of codes */
                 /* fall through */
    default:
        if (src1 > RDI)
            rex |= REX_B;
        if (src2 > RDI)
            rex |= REX_R;
        if (type == DILL_D) {
            BYTE_OUT1R3(s, 0x66, rex, 0x0f, 0x2e, ModRM(0x3, src2, src1));
        } else if (type == DILL_F) {
            BYTE_OUT3R(s, rex, 0x0f, 0x2e, ModRM(0x3, src2, src1));
        } else {
            BYTE_OUT2R(s, rex, 0x39, ModRM(0x3, src2, src1));
        }
        dill_mark_branch_location(s, label);
        if ((type == DILL_D) || (type == DILL_F)) {
            BYTE_OUT2I(s, 0x0f, fop_conds[op], 0);
        } else {
            BYTE_OUT2I(s, 0x0f, op_conds[op], 0);
        }
    }
    x86_64_nop(s);
}